

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_POW(Context *ctx)

{
  SourceMod SVar1;
  int iVar2;
  int iVar3;
  size_t in_RCX;
  char *__s;
  size_t in_RDX;
  char *fmt;
  char src1 [64];
  char src0 [64];
  char dst [64];
  char buf [64];
  char acStack_118 [64];
  char local_d8 [64];
  char local_98 [64];
  char local_58 [72];
  
  SVar1 = ctx->source_args[0].src_mod;
  if ((SVar1 == SRCMOD_ABSNEGATE) || (SVar1 == SRCMOD_NONE)) {
    ctx->source_args[0].src_mod = SRCMOD_ABS;
  }
  make_ARB1_destarg_string(ctx,local_98,in_RDX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args,local_d8,in_RCX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + 1,acStack_118,in_RCX);
  if (ctx->source_args[0].src_mod == SRCMOD_ABS) {
    fmt = "POW%s, %s, %s;";
    __s = local_d8;
  }
  else {
    iVar2 = ctx->scratch_registers;
    iVar3 = iVar2 + 1;
    ctx->scratch_registers = iVar3;
    if (ctx->max_scratch_registers <= iVar2) {
      ctx->max_scratch_registers = iVar3;
    }
    __s = local_58;
    snprintf(__s,0x40,"scratch%d");
    output_line(ctx,"ABS %s, %s;",__s,local_d8);
    fmt = "POW%s, %s.x, %s;";
  }
  output_line(ctx,fmt,local_98,__s,acStack_118);
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

static void emit_ARB1_POW(Context *ctx)
{
    // we can optimize this to use nv2's |abs| construct in some cases.
    if ( (ctx->source_args[0].src_mod == SRCMOD_NONE) ||
         (ctx->source_args[0].src_mod == SRCMOD_ABSNEGATE) )
        ctx->source_args[0].src_mod = SRCMOD_ABS;

    char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
    char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_ARB1_srcarg_string(ctx, 1, src1, sizeof (src1));

    if (ctx->source_args[0].src_mod == SRCMOD_ABS)
        output_line(ctx, "POW%s, %s, %s;", dst, src0, src1);
    else
    {
        char buf[64]; allocate_ARB1_scratch_reg_name(ctx, buf, sizeof (buf));
        output_line(ctx, "ABS %s, %s;", buf, src0);
        output_line(ctx, "POW%s, %s.x, %s;", dst, buf, src1);
    } // else

    emit_ARB1_dest_modifiers(ctx);
}